

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O2

Test * __thiscall
testing::internal::TestFactoryImpl<AssertionTest_assertEqHandlerShouldBeCalled_Test>::CreateTest
          (TestFactoryImpl<AssertionTest_assertEqHandlerShouldBeCalled_Test> *this)

{
  Test *this_00;
  
  this_00 = (Test *)operator_new(0x38);
  AssertionTest_assertEqHandlerShouldBeCalled_Test::AssertionTest_assertEqHandlerShouldBeCalled_Test
            ((AssertionTest_assertEqHandlerShouldBeCalled_Test *)this_00);
  return this_00;
}

Assistant:

virtual Test* CreateTest() { return new TestClass; }